

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcryptographichash.cpp
# Opt level: O0

QByteArrayView
QCryptographicHash::hashInto
          (QSpan<std::byte,_18446744073709551615UL> buffer,
          QSpan<const_QByteArrayView,_18446744073709551615UL> data,Algorithm method)

{
  QByteArrayView QVar1;
  QByteArrayView bytes;
  int iVar2;
  size_type_conflict sVar3;
  iterator pQVar4;
  QByteArrayView *this;
  const_pointer __src;
  size_t __n;
  Algorithm in_R8D;
  long in_FS_OFFSET;
  iterator __end1;
  iterator __begin1;
  QSpan<const_QByteArrayView,_18446744073709551615UL> *__range1;
  QByteArrayView result;
  QByteArrayView part;
  QCryptographicHashPrivate hash;
  undefined4 in_stack_fffffffffffffd28;
  Algorithm in_stack_fffffffffffffd2c;
  QCryptographicHashPrivate *in_stack_fffffffffffffd30;
  QSpan<std::byte,_18446744073709551615UL> *c;
  qsizetype in_stack_fffffffffffffd40;
  storage_type *in_stack_fffffffffffffd48;
  iterator local_280;
  QByteArrayView local_258;
  qsizetype local_248;
  storage_type *local_240;
  qsizetype local_238;
  storage_type *local_230;
  QSpan<std::byte,_18446744073709551615UL> local_218;
  QByteArrayView local_208;
  QSpan<std::byte,_18446744073709551615UL> local_1f8 [31];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3 = QSpan<std::byte,_18446744073709551615UL>::size(&local_218);
  iVar2 = hashLengthInternal(in_R8D);
  if (sVar3 < iVar2) {
    QByteArrayView::QByteArrayView(&local_208);
  }
  else {
    memset(local_1f8,0xaa,0x1f0);
    QCryptographicHashPrivate::QCryptographicHashPrivate
              (in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c);
    local_280 = QSpan<const_QByteArrayView,_18446744073709551615UL>::begin
                          ((QSpan<const_QByteArrayView,_18446744073709551615UL> *)0x58e58b);
    pQVar4 = QSpan<const_QByteArrayView,_18446744073709551615UL>::end
                       ((QSpan<const_QByteArrayView,_18446744073709551615UL> *)
                        in_stack_fffffffffffffd30);
    for (; local_280 != pQVar4; local_280 = local_280 + 1) {
      local_248 = local_280->m_size;
      local_240 = local_280->m_data;
      bytes.m_data = in_stack_fffffffffffffd48;
      bytes.m_size = in_stack_fffffffffffffd40;
      local_238 = local_248;
      local_230 = local_240;
      QCryptographicHashPrivate::addData
                ((QCryptographicHashPrivate *)
                 CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),bytes);
    }
    c = local_1f8;
    QCryptographicHashPrivate::finalizeUnchecked(in_stack_fffffffffffffd30);
    local_258.m_data = &DAT_aaaaaaaaaaaaaaaa;
    local_258.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_258 = QCryptographicHashPrivate::resultView((QCryptographicHashPrivate *)0x58e664);
    this = (QByteArrayView *)QSpan<std::byte,_18446744073709551615UL>::data(&local_218);
    __src = QByteArrayView::data(&local_258);
    __n = QByteArrayView::size(&local_258);
    memcpy(this,__src,__n);
    QByteArrayView::size(&local_258);
    QSpan<std::byte,_18446744073709551615UL>::first
              ((QSpan<std::byte,_18446744073709551615UL> *)this,(size_type_conflict)c);
    QByteArrayView::QByteArrayView<QSpan<std::byte,_18446744073709551615UL>,_true>(this,c);
    QCryptographicHashPrivate::~QCryptographicHashPrivate((QCryptographicHashPrivate *)0x58e714);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar1.m_data = local_208.m_data;
    QVar1.m_size = local_208.m_size;
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QByteArrayView QCryptographicHash::hashInto(QSpan<std::byte> buffer,
                                            QSpan<const QByteArrayView> data,
                                            Algorithm method) noexcept
{
    if (buffer.size() < hashLengthInternal(method))
        return {}; // buffer too small

    QCryptographicHashPrivate hash(method);
    for (QByteArrayView part : data)
        hash.addData(part);
    hash.finalizeUnchecked(); // no mutex needed: no-one but us has access to 'hash'
    auto result = hash.resultView();
    Q_ASSERT(buffer.size() >= result.size());
    // ### optimize: have the method directly write into `buffer`
    memcpy(buffer.data(), result.data(), result.size());
    return buffer.first(result.size());
}